

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_guardedTests.cpp
# Opt level: O1

void __thiscall
rcu_guarded_rcu_guarded_allocator_Test::~rcu_guarded_rcu_guarded_allocator_Test
          (rcu_guarded_rcu_guarded_allocator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(rcu_guarded, rcu_guarded_allocator)
{
    // large value type makes it easy to distinguish nodes from zombies
    // (this avoids any dependency on the private rcu_list node types)
    constexpr size_t value_size = 256;
    auto is_zombie = [=](const event& evnt) { return evnt.size < value_size; };
    auto is_alloc = [](const event& evnt) { return evnt.allocated; };

    using T = std::aligned_storage<value_size>::type;

    event_log log;
    {
        MockAllocator<T> alloc{&log};
        rcu_guarded<rcu_list<T, std::mutex, MockAllocator<T>>> my_list(alloc);

        auto handle = my_list.lock_write();  // allocates zombie
        handle->emplace_back();  // allocates node
        handle->erase(handle->begin());  // allocates zombie

        // expect 3 allocations, two of which are zombies. just count events,
        // don't make assumptions about ordering
        EXPECT_EQ(3, log.size());
        EXPECT_EQ(3, std::count_if(log.begin(), log.end(), is_alloc));
        EXPECT_EQ(2, std::count_if(log.begin(), log.end(), is_zombie));
    }

    // expects 3 new deallocations, two of which are zombies
    EXPECT_EQ(6, log.size());
    EXPECT_EQ(3, std::count_if(log.begin(), log.end(), is_alloc));
    EXPECT_EQ(4, std::count_if(log.begin(), log.end(), is_zombie));
}